

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::torrent_log_alert::~torrent_log_alert(torrent_log_alert *this)

{
  torrent_log_alert *this_local;
  
  ~torrent_log_alert(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

struct TORRENT_EXPORT torrent_log_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT torrent_log_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, char const* fmt, va_list v);

		TORRENT_DEFINE_ALERT(torrent_log_alert, 80)

		static inline constexpr alert_category_t static_category = alert_category::torrent_log;
		std::string message() const override;

		// returns the log message
		char const* log_message() const;

#if TORRENT_ABI_VERSION == 1
		// returns the log message
		TORRENT_DEPRECATED
		char const* msg() const;
#endif

	private:
		aux::allocation_slot m_str_idx;
	}